

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O2

void __thiscall QLayout::~QLayout(QLayout *this)

{
  QWidget *pQVar1;
  QLayout *pQVar2;
  long lVar3;
  
  *(undefined ***)this = &PTR_metaObject_007c0930;
  (this->super_QLayoutItem)._vptr_QLayoutItem = (_func_int **)&PTR__QLayout_007c0a30;
  lVar3 = *(long *)&this->field_0x8;
  if ((((*(byte *)(lVar3 + 0x8c) & 1) != 0) && (*(long *)(lVar3 + 0x10) != 0)) &&
     ((*(byte *)(*(long *)(*(long *)(lVar3 + 0x10) + 8) + 0x30) & 1) != 0)) {
    pQVar1 = parentWidget(this);
    pQVar2 = QWidget::layout(pQVar1);
    if (pQVar2 == this) {
      pQVar1 = parentWidget(this);
      *(undefined8 *)(*(long *)&pQVar1->field_0x8 + 0x98) = 0;
      goto LAB_002e3c29;
    }
    lVar3 = *(long *)&this->field_0x8;
  }
  pQVar2 = QtPrivate::qobject_cast_helper<QLayout*,QObject>(*(QObject **)(lVar3 + 0x10));
  if (pQVar2 != (QLayout *)0x0) {
    removeItem(pQVar2,&this->super_QLayoutItem);
  }
LAB_002e3c29:
  QLayoutItem::~QLayoutItem(&this->super_QLayoutItem);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

QLayout::~QLayout()
{
    Q_D(QLayout);
    if (d->topLevel && parent() && parent()->isWidgetType() && parentWidget()->layout() == this)
        parentWidget()->d_func()->layout = nullptr;
    else if (QLayout *parentLayout = qobject_cast<QLayout *>(parent()))
        parentLayout->removeItem(this);
}